

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O3

void Int_ManPrepareInter(Int_Man_t *p)

{
  uint uVar1;
  Sto_Cls_t *pSVar2;
  uint *puVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  
  if (8 < p->nVarsAB) {
    __assert_fail("p->nVarsAB <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                  ,0x3c3,"void Int_ManPrepareInter(Int_Man_t *)");
  }
  for (pSVar2 = p->pCnf->pHead;
      (pSVar2 != (Sto_Cls_t *)0x0 && (uVar5 = *(uint *)&pSVar2->field_0x1c, (uVar5 & 2) != 0));
      pSVar2 = pSVar2->pNext) {
    if ((uVar5 & 1) == 0) {
      lVar7 = (long)p->nWords;
      if (0 < lVar7) {
        memset(p->pInters + pSVar2->Id * lVar7,0xff,lVar7 << 2);
      }
    }
    else {
      puVar3 = p->pInters;
      lVar7 = (long)p->nWords;
      if (0 < lVar7) {
        memset(puVar3 + pSVar2->Id * lVar7,0,lVar7 << 2);
        uVar5 = *(uint *)&pSVar2->field_0x1c;
      }
      if ((uVar5 & 0x7fffff8) != 0) {
        piVar4 = p->pVarTypes;
        uVar6 = 0;
        do {
          uVar5 = *(uint *)((long)&pSVar2[1].pNext + uVar6 * 4);
          if (piVar4[(int)uVar5 >> 1] < 0) {
            uVar9 = ~piVar4[(int)uVar5 >> 1];
            if (p->nVarsAB <= (int)uVar9) {
              __assert_fail("VarAB >= 0 && VarAB < p->nVarsAB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                            ,0x3d6,"void Int_ManPrepareInter(Int_Man_t *)");
            }
            uVar1 = p->nWords;
            iVar10 = pSVar2->Id * uVar1;
            lVar7 = (ulong)uVar9 * 0x20;
            if ((uVar5 & 1) == 0) {
              if (0 < (int)uVar1) {
                uVar8 = (ulong)uVar1 + 1;
                do {
                  puVar3[(long)iVar10 + (uVar8 - 2)] =
                       puVar3[(long)iVar10 + (uVar8 - 2)] |
                       *(uint *)(&UNK_009ff9a8 + uVar8 * 4 + lVar7);
                  uVar8 = uVar8 - 1;
                } while (1 < uVar8);
              }
            }
            else if (0 < (int)uVar1) {
              uVar8 = (ulong)uVar1 + 1;
              do {
                puVar3[(long)iVar10 + (uVar8 - 2)] =
                     puVar3[(long)iVar10 + (uVar8 - 2)] |
                     ~*(uint *)(&UNK_009ff9a8 + uVar8 * 4 + lVar7);
                uVar8 = uVar8 - 1;
              } while (1 < uVar8);
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (*(uint *)&pSVar2->field_0x1c >> 3 & 0xffffff));
      }
    }
  }
  return;
}

Assistant:

void Int_ManPrepareInter( Int_Man_t * p )
{
    // elementary truth tables
    unsigned uTruths[8][8] = {
        { 0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA },
        { 0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC },
        { 0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0 },
        { 0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00 },
        { 0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000 }, 
        { 0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF } 
    };
    Sto_Cls_t * pClause;
    int Var, VarAB, v;
    assert( p->nVarsAB <= 8 );

    // set interpolants for root clauses
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( !pClause->fA ) // clause of B
        {
            Int_ManTruthFill( Int_ManTruthRead(p, pClause), p->nWords );
//            Int_ManPrintInterOne( p, pClause );
            continue;
        }
        // clause of A
        Int_ManTruthClear( Int_ManTruthRead(p, pClause), p->nWords );
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( p->pVarTypes[Var] < 0 ) // global var
            {
                VarAB = -p->pVarTypes[Var]-1;
                assert( VarAB >= 0 && VarAB < p->nVarsAB );
                if ( lit_sign(pClause->pLits[v]) ) // negative var
                    Int_ManTruthOrNot( Int_ManTruthRead(p, pClause), uTruths[VarAB], p->nWords );
                else
                    Int_ManTruthOr( Int_ManTruthRead(p, pClause), uTruths[VarAB], p->nWords );
            }
        }
//        Int_ManPrintInterOne( p, pClause );
    }
}